

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleBaseResolveAndPerSampleFetch.cpp
# Opt level: O0

VkPipelineMultisampleStateCreateInfo * __thiscall
vkt::pipeline::multisample::MSInstanceBaseResolveAndPerSampleFetch::getMSStateCreateInfo
          (VkPipelineMultisampleStateCreateInfo *__return_storage_ptr__,
          MSInstanceBaseResolveAndPerSampleFetch *this,ImageMSParams *imageMSParams)

{
  ImageMSParams *imageMSParams_local;
  MSInstanceBaseResolveAndPerSampleFetch *this_local;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->rasterizationSamples = imageMSParams->numSamples;
  __return_storage_ptr__->sampleShadingEnable = 1;
  __return_storage_ptr__->minSampleShading = 1.0;
  __return_storage_ptr__->pSampleMask = (VkSampleMask *)0x0;
  __return_storage_ptr__->alphaToCoverageEnable = 0;
  __return_storage_ptr__->alphaToOneEnable = 0;
  return __return_storage_ptr__;
}

Assistant:

VkPipelineMultisampleStateCreateInfo MSInstanceBaseResolveAndPerSampleFetch::getMSStateCreateInfo (const ImageMSParams& imageMSParams) const
{
	const VkPipelineMultisampleStateCreateInfo multisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,		// VkStructureType							sType;
		DE_NULL,														// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0u,						// VkPipelineMultisampleStateCreateFlags	flags;
		imageMSParams.numSamples,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_TRUE,														// VkBool32									sampleShadingEnable;
		1.0f,															// float									minSampleShading;
		DE_NULL,														// const VkSampleMask*						pSampleMask;
		VK_FALSE,														// VkBool32									alphaToCoverageEnable;
		VK_FALSE,														// VkBool32									alphaToOneEnable;
	};

	return multisampleStateInfo;
}